

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minReEnter(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *sel,
            number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *maxabs,SPxId *id,int nr,bool polish)

{
  uint *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar3;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *w;
  pointer pnVar4;
  undefined8 uVar5;
  type_conflict5 tVar6;
  bool bVar7;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar9;
  int iVar10;
  cpp_dec_float<100U,_int,_void> *v;
  long lVar11;
  cpp_dec_float<100U,_int,_void> *u;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  bool local_1c9;
  int32_t local_1c0;
  fpclass_type local_1bc;
  int local_1b8;
  cpp_dec_float<100U,_int,_void> local_1a8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_150;
  long local_148;
  cpp_dec_float<100U,_int,_void> *local_140;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_138;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_130;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  local_1a8.data._M_elems[0xc] = 0;
  local_1a8.data._M_elems[0xd] = 0;
  local_1a8.data._M_elems._56_5_ = 0;
  local_1a8.data._M_elems[8] = 0;
  local_1a8.data._M_elems[9] = 0;
  local_1a8.data._M_elems[10] = 0;
  local_1a8.data._M_elems[0xb] = 0;
  local_1a8.data._M_elems[4] = 0;
  local_1a8.data._M_elems[5] = 0;
  local_1a8.data._M_elems[6] = 0;
  local_1a8.data._M_elems[7] = 0;
  local_1a8.data._M_elems[0] = 0;
  local_1a8.data._M_elems[1] = 0;
  local_1a8.data._M_elems[2] = 0;
  local_1a8.data._M_elems[3] = 0;
  local_1a8.data._M_elems[0xf]._1_3_ = 0;
  local_1a8.exp = 0;
  local_1a8.neg = false;
  local_d8.fpclass = cpp_dec_float_finite;
  local_d8.prec_elem = 0x10;
  local_d8.data._M_elems[0] = 0;
  local_d8.data._M_elems[1] = 0;
  local_d8.data._M_elems[2] = 0;
  local_d8.data._M_elems[3] = 0;
  local_d8.data._M_elems[4] = 0;
  local_d8.data._M_elems[5] = 0;
  local_d8.data._M_elems[6] = 0;
  local_d8.data._M_elems[7] = 0;
  local_d8.data._M_elems[8] = 0;
  local_d8.data._M_elems[9] = 0;
  local_d8.data._M_elems[10] = 0;
  local_d8.data._M_elems[0xb] = 0;
  local_d8.data._M_elems[0xc] = 0;
  local_d8.data._M_elems[0xd] = 0;
  local_d8.data._M_elems._56_5_ = 0;
  local_d8.data._M_elems[0xf]._1_3_ = 0;
  local_d8.exp = 0;
  local_d8.neg = false;
  pSVar2 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pUVar3 = pSVar2->thePvec;
  w = pSVar2->theCoPvec;
  iVar10 = (id->super_DataKey).info * pSVar2->theRep;
  local_140 = &maxabs->m_backend;
  if (iVar10 < 0) {
    lVar11 = (long)nr;
    if (0 < pSVar2->theRep *
            ((pSVar2->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.costat)->data[lVar11]) {
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clearIdx(&w->thedelta,nr);
      return true;
    }
    pVVar8 = pSVar2->theCoUbound;
    local_130 = pSVar2->theCoLbound;
    pnVar4 = (w->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[lVar11].m_backend.data;
    local_1a8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[lVar11].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar4[lVar11].m_backend.data + 0x10);
    local_1a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_1a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar4[lVar11].m_backend.data + 0x20);
    local_1a8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_1a8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar4[lVar11].m_backend.data + 0x30);
    local_1a8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    uVar5 = *(undefined8 *)(puVar1 + 2);
    local_1a8.data._M_elems._56_5_ = SUB85(uVar5,0);
    local_1a8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    local_1b8 = pnVar4[lVar11].m_backend.exp;
    local_1c9 = pnVar4[lVar11].m_backend.neg;
    local_1bc = pnVar4[lVar11].m_backend.fpclass;
    local_1c0 = pnVar4[lVar11].m_backend.prec_elem;
    local_1a8.exp = local_1b8;
    local_1a8.neg = local_1c9;
    local_1a8.fpclass = local_1bc;
    local_1a8.prec_elem = local_1c0;
    local_148 = lVar11;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_128,&w->thedelta,nr);
    local_d8.data._M_elems[0xc] = local_128.data._M_elems[0xc];
    local_d8.data._M_elems[0xd] = local_128.data._M_elems[0xd];
    local_d8.data._M_elems[8] = local_128.data._M_elems[8];
    local_d8.data._M_elems[9] = local_128.data._M_elems[9];
    local_d8.data._M_elems[10] = local_128.data._M_elems[10];
    local_d8.data._M_elems[0xb] = local_128.data._M_elems[0xb];
    local_d8.data._M_elems[4] = local_128.data._M_elems[4];
    local_d8.data._M_elems[5] = local_128.data._M_elems[5];
    local_d8.data._M_elems[6] = local_128.data._M_elems[6];
    local_d8.data._M_elems[7] = local_128.data._M_elems[7];
    local_d8.data._M_elems[0] = local_128.data._M_elems[0];
    local_d8.data._M_elems[1] = local_128.data._M_elems[1];
    local_d8.data._M_elems[2] = local_128.data._M_elems[2];
    local_d8.data._M_elems[3] = local_128.data._M_elems[3];
    local_d8.exp = local_128.exp;
    local_d8.neg = local_128.neg;
    local_d8.fpclass = local_128.fpclass;
    local_d8.prec_elem = local_128.prec_elem;
    local_128.data._M_elems._0_8_ = 0.0;
    tVar6 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_d8,(double *)&local_128);
    if (tVar6) {
      pVVar9 = ((this->
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->theCoLbound;
    }
    else {
      pVVar9 = ((this->
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->theCoUbound;
    }
    local_88.fpclass = cpp_dec_float_finite;
    local_88.prec_elem = 0x10;
    local_88.data._M_elems[0] = 0;
    local_88.data._M_elems[1] = 0;
    local_88.data._M_elems[2] = 0;
    local_88.data._M_elems[3] = 0;
    local_88.data._M_elems[4] = 0;
    local_88.data._M_elems[5] = 0;
    local_88.data._M_elems[6] = 0;
    local_88.data._M_elems[7] = 0;
    local_88.data._M_elems[8] = 0;
    local_88.data._M_elems[9] = 0;
    local_88.data._M_elems[10] = 0;
    local_88.data._M_elems[0xb] = 0;
    local_88.data._M_elems[0xc] = 0;
    local_88.data._M_elems[0xd] = 0;
    local_88.data._M_elems._56_5_ = 0;
    local_88.data._M_elems[0xf]._1_3_ = 0;
    local_88.exp = 0;
    local_88.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_88,
               &(pVVar9->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend,
               &(w->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend);
    local_128.fpclass = cpp_dec_float_finite;
    local_128.prec_elem = 0x10;
    local_128.data._M_elems._0_8_ = 0.0;
    local_128.data._M_elems[2] = 0;
    local_128.data._M_elems[3] = 0;
    local_128.data._M_elems[4] = 0;
    local_128.data._M_elems[5] = 0;
    local_128.data._M_elems[6] = 0;
    local_128.data._M_elems[7] = 0;
    local_128.data._M_elems[8] = 0;
    local_128.data._M_elems[9] = 0;
    local_128.data._M_elems[10] = 0;
    local_128.data._M_elems[0xb] = 0;
    local_128.data._M_elems[0xc] = 0;
    local_128.data._M_elems[0xd] = 0;
    local_128.data._M_elems._56_5_ = 0;
    local_128.data._M_elems[0xf]._1_3_ = 0;
    local_128.exp = 0;
    local_128.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_128,&local_88,&local_d8);
    *(undefined8 *)((sel->m_backend).data._M_elems + 0xc) = local_128.data._M_elems._48_8_;
    *(ulong *)((sel->m_backend).data._M_elems + 0xe) =
         CONCAT35(local_128.data._M_elems[0xf]._1_3_,local_128.data._M_elems._56_5_);
    *(undefined8 *)((sel->m_backend).data._M_elems + 8) = local_128.data._M_elems._32_8_;
    *(undefined8 *)((sel->m_backend).data._M_elems + 10) = local_128.data._M_elems._40_8_;
    *(undefined8 *)((sel->m_backend).data._M_elems + 4) = local_128.data._M_elems._16_8_;
    *(undefined8 *)((sel->m_backend).data._M_elems + 6) = local_128.data._M_elems._24_8_;
    *(undefined8 *)(sel->m_backend).data._M_elems = local_128.data._M_elems._0_8_;
    *(undefined8 *)((sel->m_backend).data._M_elems + 2) = local_128.data._M_elems._8_8_;
    (sel->m_backend).exp = local_128.exp;
    (sel->m_backend).neg = local_128.neg;
    (sel->m_backend).fpclass = local_128.fpclass;
    (sel->m_backend).prec_elem = local_128.prec_elem;
  }
  else {
    if (iVar10 == 0) {
      return true;
    }
    local_150 = pSVar2->theUbound;
    local_130 = pSVar2->theLbound;
    lVar11 = (long)nr;
    local_138 = &pUVar3->thedelta;
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator*((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_128,
                (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((pSVar2->thevectors->set).theitem + (pSVar2->thevectors->set).thekey[lVar11].idx
                   ),&w->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               );
    pnVar4 = (pUVar3->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)(pnVar4 + lVar11) + 0x30) = local_128.data._M_elems._48_8_;
    *(ulong *)((long)(pnVar4 + lVar11) + 0x38) =
         CONCAT35(local_128.data._M_elems[0xf]._1_3_,local_128.data._M_elems._56_5_);
    *(undefined8 *)((long)(pnVar4 + lVar11) + 0x20) = local_128.data._M_elems._32_8_;
    *(undefined8 *)((long)(pnVar4 + lVar11) + 0x28) = local_128.data._M_elems._40_8_;
    *(undefined8 *)((long)(pnVar4 + lVar11) + 0x10) = local_128.data._M_elems._16_8_;
    *(undefined8 *)((long)(pnVar4 + lVar11) + 0x18) = local_128.data._M_elems._24_8_;
    *(undefined8 *)&pnVar4[lVar11].m_backend = local_128.data._M_elems._0_8_;
    *(undefined8 *)((long)&pnVar4[lVar11].m_backend + 8) = local_128.data._M_elems._8_8_;
    *(int *)((long)(pnVar4 + lVar11) + 0x40) = local_128.exp;
    *(bool *)((long)(pnVar4 + lVar11) + 0x44) = local_128.neg;
    *(undefined8 *)((long)(pnVar4 + lVar11) + 0x48) = local_128._72_8_;
    pSVar2 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    if (0 < pSVar2->theRep *
            ((pSVar2->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.stat)->data[lVar11]) {
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clearIdx(local_138,nr);
      return true;
    }
    pnVar4 = (pUVar3->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[lVar11].m_backend;
    local_1a8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[lVar11].m_backend + 8);
    local_1a8.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar4 + lVar11) + 0x10);
    local_1a8.data._M_elems._24_8_ = *(undefined8 *)((long)(pnVar4 + lVar11) + 0x18);
    local_1a8.data._M_elems._32_8_ = *(undefined8 *)((long)(pnVar4 + lVar11) + 0x20);
    local_1a8.data._M_elems._40_8_ = *(undefined8 *)((long)(pnVar4 + lVar11) + 0x28);
    local_1a8.data._M_elems._48_8_ = *(undefined8 *)((long)(pnVar4 + lVar11) + 0x30);
    uVar5 = *(undefined8 *)((long)(pnVar4 + lVar11) + 0x38);
    local_1a8.data._M_elems._56_5_ = SUB85(uVar5,0);
    local_1a8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    local_1b8 = *(int *)((long)(pnVar4 + lVar11) + 0x40);
    local_1c9 = *(bool *)((long)(pnVar4 + lVar11) + 0x44);
    local_1bc = *(fpclass_type *)((long)(pnVar4 + lVar11) + 0x48);
    local_1c0 = *(int32_t *)((long)(pnVar4 + lVar11) + 0x4c);
    local_1a8.exp = local_1b8;
    local_1a8.neg = local_1c9;
    local_1a8.fpclass = local_1bc;
    local_1a8.prec_elem = local_1c0;
    local_148 = lVar11;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_128,local_138,nr);
    local_d8.data._M_elems[0xc] = local_128.data._M_elems[0xc];
    local_d8.data._M_elems[0xd] = local_128.data._M_elems[0xd];
    local_d8.data._M_elems[8] = local_128.data._M_elems[8];
    local_d8.data._M_elems[9] = local_128.data._M_elems[9];
    local_d8.data._M_elems[10] = local_128.data._M_elems[10];
    local_d8.data._M_elems[0xb] = local_128.data._M_elems[0xb];
    local_d8.data._M_elems[4] = local_128.data._M_elems[4];
    local_d8.data._M_elems[5] = local_128.data._M_elems[5];
    local_d8.data._M_elems[6] = local_128.data._M_elems[6];
    local_d8.data._M_elems[7] = local_128.data._M_elems[7];
    local_d8.data._M_elems[0] = local_128.data._M_elems[0];
    local_d8.data._M_elems[1] = local_128.data._M_elems[1];
    local_d8.data._M_elems[2] = local_128.data._M_elems[2];
    local_d8.data._M_elems[3] = local_128.data._M_elems[3];
    local_d8.exp = local_128.exp;
    local_d8.neg = local_128.neg;
    local_d8.fpclass = local_128.fpclass;
    local_d8.prec_elem = local_128.prec_elem;
    local_128.data._M_elems._0_8_ = 0.0;
    tVar6 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_d8,(double *)&local_128);
    if (tVar6) {
      pVVar8 = ((this->
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->theLbound;
    }
    else {
      pVVar8 = ((this->
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->theUbound;
    }
    local_88.fpclass = cpp_dec_float_finite;
    local_88.prec_elem = 0x10;
    local_88.data._M_elems[0] = 0;
    local_88.data._M_elems[1] = 0;
    local_88.data._M_elems[2] = 0;
    local_88.data._M_elems[3] = 0;
    local_88.data._M_elems[4] = 0;
    local_88.data._M_elems[5] = 0;
    local_88.data._M_elems[6] = 0;
    local_88.data._M_elems[7] = 0;
    local_88.data._M_elems[8] = 0;
    local_88.data._M_elems[9] = 0;
    local_88.data._M_elems[10] = 0;
    local_88.data._M_elems[0xb] = 0;
    local_88.data._M_elems[0xc] = 0;
    local_88.data._M_elems[0xd] = 0;
    local_88.data._M_elems._56_5_ = 0;
    local_88.data._M_elems[0xf]._1_3_ = 0;
    local_88.exp = 0;
    local_88.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_88,
               &(pVVar8->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend,
               &(pUVar3->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend);
    local_128.fpclass = cpp_dec_float_finite;
    local_128.prec_elem = 0x10;
    local_128.data._M_elems._0_8_ = 0.0;
    local_128.data._M_elems[2] = 0;
    local_128.data._M_elems[3] = 0;
    local_128.data._M_elems[4] = 0;
    local_128.data._M_elems[5] = 0;
    local_128.data._M_elems[6] = 0;
    local_128.data._M_elems[7] = 0;
    local_128.data._M_elems[8] = 0;
    local_128.data._M_elems[9] = 0;
    local_128.data._M_elems[10] = 0;
    local_128.data._M_elems[0xb] = 0;
    local_128.data._M_elems[0xc] = 0;
    local_128.data._M_elems[0xd] = 0;
    local_128.data._M_elems._56_5_ = 0;
    local_128.data._M_elems[0xf]._1_3_ = 0;
    local_128.exp = 0;
    local_128.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_128,&local_88,&local_d8);
    *(undefined8 *)((sel->m_backend).data._M_elems + 0xc) = local_128.data._M_elems._48_8_;
    *(ulong *)((sel->m_backend).data._M_elems + 0xe) =
         CONCAT35(local_128.data._M_elems[0xf]._1_3_,local_128.data._M_elems._56_5_);
    *(undefined8 *)((sel->m_backend).data._M_elems + 8) = local_128.data._M_elems._32_8_;
    *(undefined8 *)((sel->m_backend).data._M_elems + 10) = local_128.data._M_elems._40_8_;
    *(undefined8 *)((sel->m_backend).data._M_elems + 4) = local_128.data._M_elems._16_8_;
    *(undefined8 *)((sel->m_backend).data._M_elems + 6) = local_128.data._M_elems._24_8_;
    *(undefined8 *)(sel->m_backend).data._M_elems = local_128.data._M_elems._0_8_;
    *(undefined8 *)((sel->m_backend).data._M_elems + 2) = local_128.data._M_elems._8_8_;
    (sel->m_backend).exp = local_128.exp;
    (sel->m_backend).neg = local_128.neg;
    (sel->m_backend).fpclass = local_128.fpclass;
    (sel->m_backend).prec_elem = local_128.prec_elem;
    pVVar8 = local_150;
  }
  pVVar9 = local_130;
  lVar11 = local_148;
  bVar7 = boost::multiprecision::operator!=
                    ((pVVar8->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_148,
                     (local_130->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_148);
  if (bVar7) {
    local_128.fpclass = cpp_dec_float_finite;
    local_128.prec_elem = 0x10;
    local_128.data._M_elems._0_8_ = 0.0;
    local_128.data._M_elems[2] = 0;
    local_128.data._M_elems[3] = 0;
    local_128.data._M_elems[4] = 0;
    local_128.data._M_elems[5] = 0;
    local_128.data._M_elems[6] = 0;
    local_128.data._M_elems[7] = 0;
    local_128.data._M_elems[8] = 0;
    local_128.data._M_elems[9] = 0;
    local_128.data._M_elems[10] = 0;
    local_128.data._M_elems[0xb] = 0;
    local_128.data._M_elems[0xc] = 0;
    local_128.data._M_elems[0xd] = 0;
    local_128.data._M_elems._56_5_ = 0;
    local_128.data._M_elems[0xf]._1_3_ = 0;
    local_128.exp = 0;
    local_128.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_128,&(this->fastDelta).m_backend,local_140);
    tVar6 = boost::multiprecision::operator>
                      (sel,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_128);
    if ((tVar6) &&
       (boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)sel,0.0), !polish)) {
      local_128.data._M_elems._0_8_ = 0.0;
      tVar6 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_d8,(double *)&local_128);
      this_00 = &((this->
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver)->theShift;
      if (tVar6) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&this_00->m_backend,
                   &(pVVar8->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend);
        pnVar4 = (pVVar8->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)&pnVar4[lVar11].m_backend.data = local_1a8.data._M_elems._0_8_;
        *(undefined8 *)((long)&pnVar4[lVar11].m_backend.data + 8) = local_1a8.data._M_elems._8_8_;
        puVar1 = (uint *)((long)&pnVar4[lVar11].m_backend.data + 0x10);
        *(undefined8 *)puVar1 = local_1a8.data._M_elems._16_8_;
        *(undefined8 *)(puVar1 + 2) = local_1a8.data._M_elems._24_8_;
        puVar1 = (uint *)((long)&pnVar4[lVar11].m_backend.data + 0x20);
        *(undefined8 *)puVar1 = local_1a8.data._M_elems._32_8_;
        *(undefined8 *)(puVar1 + 2) = local_1a8.data._M_elems._40_8_;
        puVar1 = (uint *)((long)&pnVar4[lVar11].m_backend.data + 0x30);
        *(undefined8 *)puVar1 = local_1a8.data._M_elems._48_8_;
        *(ulong *)(puVar1 + 2) =
             CONCAT35(local_1a8.data._M_elems[0xf]._1_3_,local_1a8.data._M_elems._56_5_);
        pnVar4[lVar11].m_backend.exp = local_1b8;
        pnVar4[lVar11].m_backend.neg = local_1c9;
        pnVar4[lVar11].m_backend.fpclass = local_1bc;
        pnVar4[lVar11].m_backend.prec_elem = local_1c0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&(((this->
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thesolver)->theShift).m_backend,
                   &(pVVar8->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend);
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&this_00->m_backend,
                   &(pVVar9->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend);
        pnVar4 = (pVVar9->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)&pnVar4[lVar11].m_backend.data = local_1a8.data._M_elems._0_8_;
        *(undefined8 *)((long)&pnVar4[lVar11].m_backend.data + 8) = local_1a8.data._M_elems._8_8_;
        puVar1 = (uint *)((long)&pnVar4[lVar11].m_backend.data + 0x10);
        *(undefined8 *)puVar1 = local_1a8.data._M_elems._16_8_;
        *(undefined8 *)(puVar1 + 2) = local_1a8.data._M_elems._24_8_;
        puVar1 = (uint *)((long)&pnVar4[lVar11].m_backend.data + 0x20);
        *(undefined8 *)puVar1 = local_1a8.data._M_elems._32_8_;
        *(undefined8 *)(puVar1 + 2) = local_1a8.data._M_elems._40_8_;
        puVar1 = (uint *)((long)&pnVar4[lVar11].m_backend.data + 0x30);
        *(undefined8 *)puVar1 = local_1a8.data._M_elems._48_8_;
        *(ulong *)(puVar1 + 2) =
             CONCAT35(local_1a8.data._M_elems[0xf]._1_3_,local_1a8.data._M_elems._56_5_);
        pnVar4[lVar11].m_backend.exp = local_1b8;
        pnVar4[lVar11].m_backend.neg = local_1c9;
        pnVar4[lVar11].m_backend.fpclass = local_1bc;
        pnVar4[lVar11].m_backend.prec_elem = local_1c0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&(((this->
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thesolver)->theShift).m_backend,
                   &(pVVar9->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend);
      }
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)sel,0.0);
    if (!polish) {
      tVar6 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_1a8,
                         (pVVar8->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar11);
      if (tVar6) {
        v = &(pVVar8->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend;
        u = &local_1a8;
      }
      else {
        u = &(pVVar9->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend;
        v = &local_1a8;
      }
      local_128.fpclass = cpp_dec_float_finite;
      local_128.prec_elem = 0x10;
      local_128.neg = false;
      local_128.exp = 0;
      local_128.data._M_elems[0xf]._1_3_ = 0;
      local_128.data._M_elems._56_5_ = 0;
      local_128.data._M_elems[0xc] = 0;
      local_128.data._M_elems[0xd] = 0;
      local_128.data._M_elems[10] = 0;
      local_128.data._M_elems[0xb] = 0;
      local_128.data._M_elems[8] = 0;
      local_128.data._M_elems[9] = 0;
      local_128.data._M_elems[6] = 0;
      local_128.data._M_elems[7] = 0;
      local_128.data._M_elems[4] = 0;
      local_128.data._M_elems[5] = 0;
      local_128.data._M_elems[2] = 0;
      local_128.data._M_elems[3] = 0;
      local_128.data._M_elems._0_8_ = 0.0;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_128,u,v);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&(((this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->theShift).m_backend,&local_128);
      pnVar4 = (pVVar9->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (uint *)((long)&pnVar4[lVar11].m_backend.data + 0x30);
      *(undefined8 *)puVar1 = local_1a8.data._M_elems._48_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_1a8.data._M_elems[0xf]._1_3_,local_1a8.data._M_elems._56_5_);
      puVar1 = (uint *)((long)&pnVar4[lVar11].m_backend.data + 0x20);
      *(undefined8 *)puVar1 = local_1a8.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = local_1a8.data._M_elems._40_8_;
      puVar1 = (uint *)((long)&pnVar4[lVar11].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_1a8.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = local_1a8.data._M_elems._24_8_;
      *(undefined8 *)&pnVar4[lVar11].m_backend.data = local_1a8.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar4[lVar11].m_backend.data + 8) = local_1a8.data._M_elems._8_8_;
      pnVar4[lVar11].m_backend.exp = local_1a8.exp;
      pnVar4[lVar11].m_backend.neg = local_1a8.neg;
      pnVar4[lVar11].m_backend.fpclass = local_1a8.fpclass;
      pnVar4[lVar11].m_backend.prec_elem = local_1a8.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&(pVVar8->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend,
                 &pnVar4[lVar11].m_backend);
    }
  }
  return false;
}

Assistant:

bool SPxFastRT<R>::minReEnter(
   R& sel,
   R maxabs,
   const SPxId& id,
   int nr,
   bool polish)
{
   R x, d;
   VectorBase<R>* up;
   VectorBase<R>* low;

   UpdateVector<R>& pvec = this->thesolver->pVec();
   SSVectorBase<R>& pupd = this->thesolver->pVec().delta();
   VectorBase<R>& upb = this->thesolver->upBound();
   VectorBase<R>& lpb = this->thesolver->lpBound();
   UpdateVector<R>& cvec = this->thesolver->coPvec();
   SSVectorBase<R>& cupd = this->thesolver->coPvec().delta();
   VectorBase<R>& ucb = this->thesolver->ucBound();
   VectorBase<R>& lcb = this->thesolver->lcBound();

   if(this->thesolver->isCoId(id))
   {
      if(this->thesolver->isCoBasic(nr))
      {
         cupd.clearIdx(nr);
         return true;
      }

      x = cvec[nr];
      d = cupd[nr];
      up = &ucb;
      low = &lcb;

      if(d > 0.0)
         sel = (this->thesolver->lcBound()[nr] - cvec[nr]) / d;
      else
         sel = (this->thesolver->ucBound()[nr] - cvec[nr]) / d;
   }

   else if(this->thesolver->isId(id))
   {
      pvec[nr] = this->thesolver->vector(nr) * cvec;

      if(this->thesolver->isBasic(nr))
      {
         pupd.clearIdx(nr);
         return true;
      }

      x = pvec[nr];
      d = pupd[nr];
      up = &upb;
      low = &lpb;

      if(d > 0.0)
         sel = (this->thesolver->lpBound()[nr] - pvec[nr]) / d;
      else
         sel = (this->thesolver->upBound()[nr] - pvec[nr]) / d;
   }

   else
      return true;

   if((*up)[nr] != (*low)[nr])
   {
      if(sel > fastDelta / maxabs)
      {
         sel = 0.0;

         // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         if(!polish)
         {
            if(d < 0.0)
            {
               this->thesolver->theShift -= (*up)[nr];
               (*up)[nr] = x;
               this->thesolver->theShift += (*up)[nr];
            }
            else
            {
               this->thesolver->theShift += (*low)[nr];
               (*low)[nr] = x;
               this->thesolver->theShift -= (*low)[nr];
            }
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         if(x > (*up)[nr])
            this->thesolver->theShift += x - (*up)[nr];
         else
            this->thesolver->theShift += (*low)[nr] - x;

         (*up)[nr] = (*low)[nr] = x;
      }
   }

   return false;
}